

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_parse_function_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::ParseFunctionGenerator::GenerateArenaString
          (ParseFunctionGenerator *this,Formatter *format,FieldDescriptor *field)

{
  size_type *psVar1;
  FieldDescriptor FVar2;
  int iVar3;
  long lVar4;
  bool bVar5;
  undefined8 in_RAX;
  undefined8 *puVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  LogMessage *pLVar8;
  FieldDescriptor *pFVar9;
  Options *in_RCX;
  undefined8 *puVar10;
  ulong uVar11;
  undefined8 uVar12;
  string default_string;
  size_type __dnew;
  undefined8 *local_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_138;
  FieldDescriptor *local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string local_f8;
  int local_d4;
  undefined1 local_d0 [56];
  Hex local_98;
  string local_88;
  LogMessage local_68;
  
  FVar2 = field[1];
  pFVar9 = field;
  if (((byte)FVar2 & 2) == 0) {
    in_RCX = (Options *)(CONCAT71((int7)((ulong)in_RAX >> 8),FVar2) & 0xffffff60);
    if (((char)in_RCX == ' ') &&
       (pFVar9 = *(FieldDescriptor **)(field + 0x10), pFVar9[0x3a] == (FieldDescriptor)0x2)) {
      if ((((byte)FVar2 & 0x10) == 0) || (*(long *)(field + 0x28) == 0)) goto LAB_002b9481;
    }
    else if ((char)in_RCX == '@') goto LAB_002b9481;
  }
  else {
LAB_002b9481:
    if (*(char *)(*(long *)(field + 0x38) + 0x4f) == '\0') {
      FieldName_abi_cxx11_((string *)local_d0,(cpp *)field,pFVar9);
      Formatter::operator()(format,"_Internal::set_has_$1$(&$has_bits$);\n",(string *)local_d0);
      if ((FieldDescriptor *)local_d0._0_8_ != (FieldDescriptor *)(local_d0 + 0x10)) {
        operator_delete((void *)local_d0._0_8_);
      }
    }
  }
  lVar4 = *(long *)(*(long *)(field + 0x40) + 8);
  if (lVar4 == 0) {
    local_138 = &local_128;
    local_d0._0_8_ = (FieldDescriptor *)0x15;
    local_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)std::__cxx11::string::_M_create((ulong *)&local_138,(ulong)local_d0);
    local_128._M_allocated_capacity = local_d0._0_8_;
    local_138->_M_allocated_capacity = 0x4655424f544f5250;
    (&local_138->_M_allocated_capacity)[1] = 0x415053454d414e5f;
    *(char *)((long)local_138 + 0xd) = 'S';
    *(char *)((long)local_138 + 0xe) = 'P';
    *(char *)((long)local_138 + 0xf) = 'A';
    *(char *)((long)local_138 + 0x10) = 'C';
    *(char *)((long)local_138 + 0x11) = 'E';
    *(char *)((long)local_138 + 0x12) = '_';
    *(char *)((long)local_138 + 0x13) = 'I';
    *(char *)((long)local_138 + 0x14) = 'D';
    local_130 = (FieldDescriptor *)local_d0._0_8_;
    local_138->_M_local_buf[local_d0._0_8_] = '\0';
    puVar6 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,0x419f58);
    local_158 = &local_148;
    puVar10 = puVar6 + 2;
    if ((undefined8 *)*puVar6 == puVar10) {
      local_148 = *puVar10;
      uStack_140 = puVar6[3];
    }
    else {
      local_148 = *puVar10;
      local_158 = (undefined8 *)*puVar6;
    }
    local_150 = puVar6[1];
    *puVar6 = puVar10;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_158);
    goto LAB_002b96f1;
  }
  QualifiedClassName_abi_cxx11_
            (&local_88,*(cpp **)(field + 0x20),(Descriptor *)this->options_,in_RCX);
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_88);
  paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(puVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 == paVar7) {
    local_128._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_128._8_8_ = puVar6[3];
    local_138 = &local_128;
  }
  else {
    local_128._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar6;
  }
  local_130 = (FieldDescriptor *)puVar6[1];
  *puVar6 = paVar7;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  MakeDefaultName_abi_cxx11_(&local_f8,(cpp *)field,local_130);
  uVar12 = (FieldDescriptor *)0xf;
  if (local_138 != &local_128) {
    uVar12 = local_128._M_allocated_capacity;
  }
  if ((ulong)uVar12 < local_130 + local_f8._M_string_length) {
    uVar12 = (FieldDescriptor *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      uVar12 = local_f8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar12 < local_130 + local_f8._M_string_length) goto LAB_002b964a;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,(ulong)local_138);
  }
  else {
LAB_002b964a:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_138,(ulong)local_f8._M_dataplus._M_p);
  }
  local_158 = &local_148;
  puVar10 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar10) {
    local_148 = *puVar10;
    uStack_140 = puVar6[3];
  }
  else {
    local_148 = *puVar10;
    local_158 = (undefined8 *)*puVar6;
  }
  local_150 = puVar6[1];
  *puVar6 = puVar10;
  puVar6[1] = 0;
  *(undefined1 *)puVar10 = 0;
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_158);
LAB_002b96f1:
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  psVar1 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_118.field_2._M_allocated_capacity = *psVar1;
    local_118.field_2._8_8_ = puVar6[3];
  }
  else {
    local_118._M_dataplus._M_p = (pointer)*puVar6;
    local_118.field_2._M_allocated_capacity = *psVar1;
  }
  local_118._M_string_length = puVar6[1];
  *puVar6 = psVar1;
  puVar6[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (lVar4 == 0) {
    if (local_158 != &local_148) {
      operator_delete(local_158);
    }
    paVar7 = &local_128;
  }
  else {
    if (local_158 != &local_148) {
      operator_delete(local_158);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    if (local_138 != &local_128) {
      operator_delete(local_138);
    }
    paVar7 = &local_88.field_2;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(&paVar7->_M_allocated_capacity)[-2] != paVar7) {
    operator_delete((undefined1 *)(&paVar7->_M_allocated_capacity)[-2]);
  }
  Formatter::operator()<>
            (format,
             "if (arena != nullptr) {\n  ptr = ctx->ReadArenaString(ptr, &$msg$$name$_, arena");
  bVar5 = IsStringInlined(field,this->options_);
  if (bVar5) {
    if ((this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      internal::LogMessage::LogMessage
                ((LogMessage *)local_d0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_parse_function_generator.cc"
                 ,0x27d);
      pLVar8 = internal::LogMessage::operator<<
                         ((LogMessage *)local_d0,"CHECK failed: !inlined_string_indices_.empty(): ")
      ;
      internal::LogFinisher::operator=((LogFinisher *)&local_68,pLVar8);
      internal::LogMessage::~LogMessage((LogMessage *)local_d0);
    }
    if (((byte)field[1] & 8) == 0) {
      pFVar9 = field + 0x20;
      uVar11 = 0x28;
    }
    else {
      pFVar9 = field + 0x28;
      if (*(long *)(field + 0x28) == 0) {
        pFVar9 = field + 0x10;
      }
      uVar11 = (ulong)(*(long *)(field + 0x28) == 0) << 5 | 0x50;
    }
    iVar3 = (this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start
            [(int)((ulong)((long)field - *(long *)(*(long *)pFVar9 + uVar11)) >> 3) * 0x38e38e39];
    if (iVar3 < 0) {
      internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_parse_function_generator.cc"
                 ,0x27f);
      pLVar8 = internal::LogMessage::operator<<
                         (&local_68,"CHECK failed: (inlined_string_index) >= (0): ");
      internal::LogFinisher::operator=((LogFinisher *)&local_98,pLVar8);
      internal::LogMessage::~LogMessage(&local_68);
    }
    local_d4 = iVar3 + 0x1f;
    if (-1 < iVar3) {
      local_d4 = iVar3;
    }
    local_d4 = local_d4 >> 5;
    local_98.value = 1L << ((byte)iVar3 & 0x1f);
    local_98.spec = ZERO_PAD_8;
    Formatter::operator()
              (format,
               ", $msg$_internal_$name$_donated(), &$msg$_inlined_string_donated_[$1$], ~0x$2$u",
               &local_d4,&local_98);
  }
  else if (*(long *)(*(long *)(field + 0x40) + 8) != 0) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_d0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_parse_function_generator.cc"
               ,0x287);
    pLVar8 = internal::LogMessage::operator<<
                       ((LogMessage *)local_d0,
                        "CHECK failed: field->default_value_string().empty(): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_68,pLVar8);
    internal::LogMessage::~LogMessage((LogMessage *)local_d0);
  }
  Formatter::operator()
            (format,
             ");\n} else {\n  ptr = ::$proto_ns$::internal::InlineGreedyStringParser($msg$$name$_.MutableNoArenaNoDefault(&$1$), ptr, ctx);\n}\nconst std::string* str = &$msg$$name$_.Get(); (void)str;\n"
             ,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  return;
}

Assistant:

void ParseFunctionGenerator::GenerateArenaString(Formatter& format,
                                                 const FieldDescriptor* field) {
  if (HasHasbit(field)) {
    format("_Internal::set_has_$1$(&$has_bits$);\n", FieldName(field));
  }
  std::string default_string =
      field->default_value_string().empty()
          ? "::" + ProtobufNamespace(options_) +
                "::internal::GetEmptyStringAlreadyInited()"
          : QualifiedClassName(field->containing_type(), options_) +
                "::" + MakeDefaultName(field) + ".get()";
  format(
      "if (arena != nullptr) {\n"
      "  ptr = ctx->ReadArenaString(ptr, &$msg$$name$_, arena");
  if (IsStringInlined(field, options_)) {
    GOOGLE_DCHECK(!inlined_string_indices_.empty());
    int inlined_string_index = inlined_string_indices_[field->index()];
    GOOGLE_DCHECK_GE(inlined_string_index, 0);
    format(
        ", $msg$_internal_$name$_donated()"
        ", &$msg$_inlined_string_donated_[$1$]"
        ", ~0x$2$u",
        inlined_string_index / 32,
        strings::Hex(1u << (inlined_string_index % 32), strings::ZERO_PAD_8));
  } else {
    GOOGLE_DCHECK(field->default_value_string().empty());
  }
  format(
      ");\n"
      "} else {\n"
      "  ptr = ::$proto_ns$::internal::InlineGreedyStringParser("
      "$msg$$name$_.MutableNoArenaNoDefault(&$1$), ptr, ctx);\n"
      "}\n"
      "const std::string* str = &$msg$$name$_.Get(); (void)str;\n",
      default_string);
}